

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  char **ppcVar1;
  string *psVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  bool bVar5;
  char *pcVar6;
  ostream *poVar7;
  pointer pbVar8;
  char **ppcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string missing;
  char *tryDirs [3];
  ostringstream e;
  string local_210;
  string *local_1f0;
  string local_1e8;
  char *local_1c8 [4];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->FindFullPathFailed != false) {
    return false;
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"GENERATED","");
  pcVar6 = GetProperty(this,(string *)local_1a8);
  bVar5 = cmSystemTools::IsOn(pcVar6);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar5) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    psVar2 = &this->FullPath;
    std::__cxx11::string::_M_assign((string *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    std::__cxx11::string::_M_append((char *)psVar2,(ulong)(this->Location).Name._M_dataplus._M_p);
    return true;
  }
  pcVar3 = (this->Location).Makefile;
  local_1c8[0] = (char *)0x0;
  local_1c8[1] = (char *)0x0;
  local_1c8[2] = (char *)0x0;
  local_1f0 = error;
  if ((this->Location).AmbiguousDirectory == false) {
    local_1c8[0] = "";
  }
  else {
    pcVar6 = cmMakefile::GetCurrentSourceDirectory(pcVar3);
    local_1c8[0] = pcVar6;
    local_1c8[1] = cmMakefile::GetCurrentBinaryDirectory(pcVar3);
    if (pcVar6 == (char *)0x0) goto LAB_0039efb1;
  }
  ppcVar9 = local_1c8;
  do {
    paVar10 = &local_210.field_2;
    local_1a8._0_8_ = local_1a8 + 0x10;
    pcVar4 = (this->Location).Directory._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar4,pcVar4 + (this->Location).Directory._M_string_length);
    if (local_1a8._8_8_ != 0) {
      std::__cxx11::string::append((char *)local_1a8);
    }
    std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(this->Location).Name._M_dataplus._M_p)
    ;
    cmsys::SystemTools::CollapseFullPath(&local_210,(string *)local_1a8,*ppcVar9);
    std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar10) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    local_210._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    bVar5 = TryFullPath(this,(string *)local_1a8,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar10) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
LAB_0039f299:
      if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
        return true;
      }
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      return true;
    }
    for (pbVar8 = (pcVar3->SourceFileExtensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != (pcVar3->SourceFileExtensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      bVar5 = TryFullPath(this,(string *)local_1a8,pbVar8);
      if (bVar5) goto LAB_0039f299;
    }
    pbVar8 = (pcVar3->HeaderFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar8 == (pcVar3->HeaderFileExtensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = true;
    }
    else {
      do {
        bVar5 = TryFullPath(this,(string *)local_1a8,pbVar8);
        if (bVar5) break;
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != (pcVar3->HeaderFileExtensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      bVar5 = !bVar5;
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar5) {
      return true;
    }
    ppcVar1 = ppcVar9 + 1;
    ppcVar9 = ppcVar9 + 1;
  } while (*ppcVar1 != (char *)0x0);
LAB_0039efb1:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar4 = (this->Location).Directory._M_dataplus._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar4,pcVar4 + (this->Location).Directory._M_string_length);
  if (local_210._M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_210);
  }
  std::__cxx11::string::_M_append((char *)&local_210,(ulong)(this->Location).Name._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Cannot find source file:\n  ",0x1b);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTried extensions",0x11);
  pbVar8 = (pcVar3->SourceFileExtensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 != (pcVar3->SourceFileExtensions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (pcVar3->SourceFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar8 = (pcVar3->HeaderFileExtensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 != (pcVar3->HeaderFileExtensions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (pcVar3->HeaderFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_1f0 == (string *)0x0) {
    pcVar3 = (this->Location).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_1e8);
  }
  else {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this->FindFullPathFailed = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If thie method has already failed once do not try again.
  if(this->FindFullPathFailed)
    {
    return false;
    }

  // If the file is generated compute the location without checking on
  // disk.
  if(this->GetPropertyAsBool("GENERATED"))
    {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetDirectory();
    this->FullPath += "/";
    this->FullPath += this->Location.GetName();
    return true;
    }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* mf = this->Location.GetMakefile();
  const char* tryDirs[3] = {0, 0, 0};
  if(this->Location.DirectoryIsAmbiguous())
    {
    tryDirs[0] = mf->GetCurrentSourceDirectory();
    tryDirs[1] = mf->GetCurrentBinaryDirectory();
    }
  else
    {
    tryDirs[0] = "";
    }
  const std::vector<std::string>& srcExts = mf->GetSourceExtensions();
  const std::vector<std::string>& hdrExts = mf->GetHeaderExtensions();
  for(const char* const* di = tryDirs; *di; ++di)
    {
    std::string tryPath = this->Location.GetDirectory();
    if(!tryPath.empty())
      {
      tryPath += "/";
      }
    tryPath += this->Location.GetName();
    tryPath = cmSystemTools::CollapseFullPath(tryPath, *di);
    if(this->TryFullPath(tryPath, ""))
      {
      return true;
      }
    for(std::vector<std::string>::const_iterator ei = srcExts.begin();
        ei != srcExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    for(std::vector<std::string>::const_iterator ei = hdrExts.begin();
        ei != hdrExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    }

  std::ostringstream e;
  std::string missing = this->Location.GetDirectory();
  if(!missing.empty())
    {
    missing += "/";
    }
  missing += this->Location.GetName();
  e << "Cannot find source file:\n  " << missing << "\nTried extensions";
  for(std::vector<std::string>::const_iterator ext = srcExts.begin();
      ext != srcExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  for(std::vector<std::string>::const_iterator ext = hdrExts.begin();
      ext != hdrExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  if(error)
    {
    *error = e.str();
    }
  else
    {
    this->Location.GetMakefile()->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  this->FindFullPathFailed = true;
  return false;
}